

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  PathDeclarationSyntax *args_2;
  IfNonePathDeclarationSyntax *pIVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_31;
  Token local_30;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = (PathDeclarationSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x60),&local_31,(BumpAllocator *)__child_stack);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::IfNonePathDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::PathDeclarationSyntax&>
                     ((BumpAllocator *)__child_stack,args,&local_30,args_2);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const IfNonePathDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<IfNonePathDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<PathDeclarationSyntax>(*node.path, alloc)
    );
}